

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O1

bool __thiscall
glslang::TIntermediate::isIntegralConversion(TIntermediate *this,TBasicType from,TBasicType to)

{
  uint uVar1;
  byte bVar2;
  
  switch(from) {
  case EbtInt8:
    if (to < EbtBool) {
      uVar1 = 0xee0;
LAB_0049d194:
      bVar2 = (byte)(uVar1 >> ((byte)to & 0x1f));
      goto LAB_0049d1a6;
    }
    break;
  case EbtUint8:
    if (to < EbtBool) {
      uVar1 = 0xec0;
      goto LAB_0049d194;
    }
    break;
  case EbtInt16:
    if (to < EbtBool) {
      uVar1 = 0xe80;
      goto LAB_0049d194;
    }
    break;
  case EbtUint16:
    bVar2 = 1;
    if (to - EbtUint < 3) goto LAB_0049d1a6;
    break;
  case EbtInt:
    bVar2 = 1;
    if (to - EbtInt64 < 2) goto LAB_0049d1a6;
    if (to == EbtUint) {
      if (this->version < 400) {
        bVar2 = this->source == EShSourceHlsl;
      }
      goto LAB_0049d1a6;
    }
    break;
  case EbtUint:
    bVar2 = 1;
    if ((to & ~EbtFloat) == EbtInt64) goto LAB_0049d1a6;
    break;
  case EbtInt64:
    bVar2 = 1;
    if (to == EbtUint64) goto LAB_0049d1a6;
  }
  bVar2 = 0;
LAB_0049d1a6:
  return (bool)(bVar2 & 1);
}

Assistant:

bool TIntermediate::isIntegralConversion(TBasicType from, TBasicType to) const
{
    switch (from) {
    case EbtInt:
        switch(to) {
        case EbtUint:
            return version >= 400 || getSource() == EShSourceHlsl;
        case EbtInt64:
        case EbtUint64:
            return true;
        default:
            break;
        }
        break;
    case EbtUint:
        switch(to) {
        case EbtInt64:
        case EbtUint64:
            return true;
        default:
            break;
        }
        break;
    case EbtInt8:
        switch (to) {
        case EbtUint8:
        case EbtInt16:
        case EbtUint16:
        case EbtUint:
        case EbtInt64:
        case EbtUint64:
            return true;
        default:
            break;
        }
        break;
    case EbtUint8:
        switch (to) {
        case EbtInt16:
        case EbtUint16:
        case EbtUint:
        case EbtInt64:
        case EbtUint64:
            return true;
        default:
            break;
        }
        break;
    case EbtInt16:
        switch(to) {
        case EbtUint16:
        case EbtUint:
        case EbtInt64:
        case EbtUint64:
            return true;
        default:
            break;
        }
        break;
    case EbtUint16:
        switch(to) {
        case EbtUint:
        case EbtInt64:
        case EbtUint64:
            return true;
        default:
            break;
        }
        break;
    case EbtInt64:
        if (to == EbtUint64) {
            return true;
        }
        break;
    default:
        break;
    }
    return false;
}